

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O1

void __thiscall
flatbuffers::rust::RustGenerator::GenNamespaceImports(RustGenerator *this,int white_spaces)

{
  CodeWriter *this_00;
  Parser *pPVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  size_type *psVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string indent;
  string prefix;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string noext;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230 [2];
  long local_220 [2];
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_290 = local_280;
  std::__cxx11::string::_M_construct((ulong)&local_290,(char)white_spaces);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->opts).generate_all == false) &&
     (p_Var5 = (pPVar1->included_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
     (_Rb_tree_header *)p_Var5 !=
     &(((this->super_BaseGenerator).parser_)->included_files_)._M_t._M_impl.super__Rb_tree_header))
  {
    do {
      if (p_Var5[1]._M_left != (_Base_ptr)0x0) {
        StripExtension(&local_70,(string *)&p_Var5[1]._M_parent);
        StripPath(&local_190,&local_70);
        pPVar1 = (this->super_BaseGenerator).parser_;
        sVar2 = (pPVar1->opts).include_prefix._M_string_length;
        if (sVar2 == 0) {
          local_2b0 = &local_2a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b0,local_290,local_288 + (long)local_290);
          std::__cxx11::string::append((char *)&local_2b0);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2b0,(ulong)local_190._M_dataplus._M_p);
          local_270 = &local_260;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_260 = *plVar6;
            lStack_258 = plVar4[3];
          }
          else {
            local_260 = *plVar6;
            local_270 = (long *)*plVar4;
          }
          local_268 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_270,
                                      (ulong)(((this->super_BaseGenerator).parser_)->opts).
                                             filename_suffix._M_dataplus._M_p);
          local_250 = &local_240;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_240 = *plVar6;
            lStack_238 = plVar4[3];
          }
          else {
            local_240 = *plVar6;
            local_250 = (long *)*plVar4;
          }
          local_248 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1b0.field_2._M_allocated_capacity = *psVar7;
            local_1b0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_1b0.field_2._M_allocated_capacity = *psVar7;
            local_1b0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_1b0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          CodeWriter::operator+=(this_00,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if (local_250 != &local_240) {
            operator_delete(local_250,local_240 + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          lVar8 = local_2a0;
          plVar4 = local_2b0;
          if (local_2b0 != &local_2a0) goto LAB_002ac19f;
        }
        else {
          local_250 = &local_240;
          pcVar3 = (pPVar1->opts).include_prefix._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_250,pcVar3,pcVar3 + sVar2);
          std::__cxx11::string::pop_back();
          local_230[0] = local_220;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_230,local_290,local_288 + (long)local_290);
          std::__cxx11::string::append((char *)local_230);
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_230,(ulong)local_250);
          local_210 = &local_200;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_200 = *plVar6;
            lStack_1f8 = plVar4[3];
          }
          else {
            local_200 = *plVar6;
            local_210 = (long *)*plVar4;
          }
          local_208 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
          local_1f0 = &local_1e0;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_1e0 = *plVar6;
            lStack_1d8 = plVar4[3];
          }
          else {
            local_1e0 = *plVar6;
            local_1f0 = (long *)*plVar4;
          }
          local_1e8 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1f0,(ulong)local_190._M_dataplus._M_p);
          local_2b0 = &local_2a0;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_2a0 = *plVar6;
            lStack_298 = plVar4[3];
          }
          else {
            local_2a0 = *plVar6;
            local_2b0 = (long *)*plVar4;
          }
          local_2a8 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_2b0,
                                      (ulong)(((this->super_BaseGenerator).parser_)->opts).
                                             filename_suffix._M_dataplus._M_p);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_260 = *plVar6;
            lStack_258 = plVar4[3];
            local_270 = &local_260;
          }
          else {
            local_260 = *plVar6;
            local_270 = (long *)*plVar4;
          }
          local_268 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1d0.field_2._M_allocated_capacity = *psVar7;
            local_1d0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_1d0.field_2._M_allocated_capacity = *psVar7;
            local_1d0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_1d0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          CodeWriter::operator+=(this_00,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if (local_270 != &local_260) {
            operator_delete(local_270,local_260 + 1);
          }
          if (local_2b0 != &local_2a0) {
            operator_delete(local_2b0,local_2a0 + 1);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0,local_1e0 + 1);
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,local_200 + 1);
          }
          if (local_230[0] != local_220) {
            operator_delete(local_230[0],local_220[0] + 1);
          }
          lVar8 = local_240;
          plVar4 = local_250;
          if (local_250 != &local_240) {
LAB_002ac19f:
            operator_delete(plVar4,lVar8 + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 !=
             &(((this->super_BaseGenerator).parser_)->included_files_)._M_t._M_impl.
              super__Rb_tree_header);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_290,local_288 + (long)local_290);
  std::__cxx11::string::append((char *)&local_d0);
  CodeWriter::operator+=(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_290,local_288 + (long)local_290);
  std::__cxx11::string::append((char *)&local_f0);
  CodeWriter::operator+=(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((((this->super_BaseGenerator).parser_)->opts).rust_serialize == true) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_290,local_288 + (long)local_290);
    std::__cxx11::string::append((char *)&local_110);
    CodeWriter::operator+=(this_00,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_290,local_288 + (long)local_290);
    std::__cxx11::string::append((char *)&local_130);
    CodeWriter::operator+=(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    CodeWriter::operator+=(this_00,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_290,local_288 + (long)local_290);
  std::__cxx11::string::append((char *)&local_150);
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_290,local_288 + (long)local_290);
  std::__cxx11::string::append((char *)&local_170);
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  return;
}

Assistant:

void GenNamespaceImports(const int white_spaces) {
    // DO not use global attributes (i.e. #![...]) since it interferes
    // with users who include! generated files.
    // See: https://github.com/google/flatbuffers/issues/6261
    std::string indent = std::string(white_spaces, ' ');
    code_ += "";
    if (!parser_.opts.generate_all) {
      for (auto it = parser_.included_files_.begin();
           it != parser_.included_files_.end(); ++it) {
        if (it->second.empty()) continue;
        auto noext = flatbuffers::StripExtension(it->second);
        auto basename = flatbuffers::StripPath(noext);

        if (parser_.opts.include_prefix.empty()) {
          code_ += indent + "use crate::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        } else {
          auto prefix = parser_.opts.include_prefix;
          prefix.pop_back();

          code_ += indent + "use crate::" + prefix + "::" + basename +
                   parser_.opts.filename_suffix + "::*;";
        }
      }
    }
    code_ += indent + "use core::mem;";
    code_ += indent + "use core::cmp::Ordering;";
    code_ += "";
    if (parser_.opts.rust_serialize) {
      code_ += indent + "extern crate serde;";
      code_ +=
          indent +
          "use self::serde::ser::{Serialize, Serializer, SerializeStruct};";
      code_ += "";
    }
    code_ += indent + "extern crate flatbuffers;";
    code_ += indent + "use self::flatbuffers::{EndianScalar, Follow};";
  }